

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

int l_strcmp(TString *ts1,TString *ts2)

{
  bool bVar1;
  uint uVar2;
  TString *pTVar3;
  TString *pTVar4;
  char *__s2;
  uint unaff_EBP;
  TString *pTVar5;
  TString *pTVar6;
  char *__s1;
  
  pTVar5 = (TString *)(ulong)ts1->shrlen;
  if (pTVar5 == (TString *)0xff) {
    pTVar5 = (ts1->u).hnext;
  }
  pTVar6 = (TString *)(ulong)ts2->shrlen;
  if (pTVar6 == (TString *)0xff) {
    pTVar6 = (ts2->u).hnext;
  }
  __s1 = ts1->contents;
  __s2 = ts2->contents;
  do {
    uVar2 = strcoll(__s1,__s2);
    if (uVar2 == 0) {
      pTVar3 = (TString *)strlen(__s1);
      pTVar4 = (TString *)strlen(__s2);
      if (pTVar4 == pTVar6) {
        unaff_EBP = (uint)(pTVar3 != pTVar5);
      }
      else {
        if (pTVar3 != pTVar5) {
          __s1 = __s1 + (long)pTVar3 + 1;
          pTVar5 = (TString *)((long)pTVar5 - (long)((long)&pTVar3->next + 1));
          __s2 = __s2 + (long)pTVar4 + 1;
          pTVar6 = (TString *)((long)pTVar6 - (long)((long)&pTVar4->next + 1));
          bVar1 = true;
          goto LAB_00129942;
        }
        unaff_EBP = 0xffffffff;
      }
      bVar1 = false;
    }
    else {
      bVar1 = false;
      unaff_EBP = uVar2;
    }
LAB_00129942:
    if (!bVar1) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

static int l_strcmp (const TString *ts1, const TString *ts2) {
  const char *s1 = getstr(ts1);
  size_t rl1 = tsslen(ts1);  /* real length */
  const char *s2 = getstr(ts2);
  size_t rl2 = tsslen(ts2);
  for (;;) {  /* for each segment */
    int temp = strcoll(s1, s2);
    if (temp != 0)  /* not equal? */
      return temp;  /* done */
    else {  /* strings are equal up to a '\0' */
      size_t zl1 = strlen(s1);  /* index of first '\0' in 's1' */
      size_t zl2 = strlen(s2);  /* index of first '\0' in 's2' */
      if (zl2 == rl2)  /* 's2' is finished? */
        return (zl1 == rl1) ? 0 : 1;  /* check 's1' */
      else if (zl1 == rl1)  /* 's1' is finished? */
        return -1;  /* 's1' is less than 's2' ('s2' is not finished) */
      /* both strings longer than 'zl'; go on comparing after the '\0' */
      zl1++; zl2++;
      s1 += zl1; rl1 -= zl1; s2 += zl2; rl2 -= zl2;
    }
  }
}